

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall DQuitMenu::DQuitMenu(DQuitMenu *this,bool playsound)

{
  int iVar1;
  uint uVar2;
  FString *pFVar3;
  char *pcVar4;
  char *msg;
  FString EndString;
  FName local_18;
  int messageindex;
  DQuitMenu *pDStack_10;
  bool playsound_local;
  DQuitMenu *this_local;
  
  messageindex._3_1_ = playsound;
  pDStack_10 = this;
  FName::FName(&local_18,NAME_None);
  DMessageBoxMenu::DMessageBoxMenu
            (&this->super_DMessageBoxMenu,(DMenu *)0x0,(char *)0x0,0,false,&local_18);
  (this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009ee698;
  iVar1 = gametic;
  uVar2 = TArray<FString,_FString>::Size(&gameinfo.quitmessages);
  FString::FString((FString *)&msg);
  pFVar3 = TArray<FString,_FString>::operator[]
                     (&gameinfo.quitmessages,(long)(int)((uint)iVar1 % uVar2));
  pcVar4 = FString::operator_cast_to_char_(pFVar3);
  if (*pcVar4 == '$') {
    if (pcVar4[1] == '*') {
      pcVar4 = FStringTable::operator()(&GStrings,pcVar4 + 2);
      FString::operator=((FString *)&msg,pcVar4);
    }
    else {
      pcVar4 = FStringTable::operator()(&GStrings,pcVar4 + 1);
      FStringTable::operator()(&GStrings,"DOSY");
      FString::Format((FString *)&msg,"%s\n\n%s",pcVar4);
    }
  }
  else {
    pFVar3 = TArray<FString,_FString>::operator[]
                       (&gameinfo.quitmessages,(long)(int)((uint)iVar1 % uVar2));
    FString::operator=((FString *)&msg,pFVar3);
  }
  pcVar4 = FString::operator_cast_to_char_((FString *)&msg);
  DMessageBoxMenu::Init
            (&this->super_DMessageBoxMenu,(DMenu *)0x0,pcVar4,0,(bool)(messageindex._3_1_ & 1));
  FString::~FString((FString *)&msg);
  return;
}

Assistant:

DQuitMenu::DQuitMenu(bool playsound)
{
	int messageindex = gametic % gameinfo.quitmessages.Size();
	FString EndString;
	const char *msg = gameinfo.quitmessages[messageindex];
	if (msg[0] == '$') 
	{
		if (msg[1] == '*')
		{
			EndString = GStrings(msg+2);
		}
		else
		{
			EndString.Format("%s\n\n%s", GStrings(msg+1), GStrings("DOSY"));
		}
	}
	else EndString = gameinfo.quitmessages[messageindex];

	Init(NULL, EndString, 0, playsound);
}